

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,1,4,1,1,4>,Eigen::Matrix<double,1,4,1,1,4>,Eigen::internal::swap_assign_op<double>>
               (Matrix<double,_1,_4,_1,_1,_4> *dst,Matrix<double,_1,_4,_1,_1,_4> *src,
               swap_assign_op<double> *func)

{
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Kernel kernel;
  DstEvaluatorType local_40;
  SrcEvaluatorType local_30;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::swap_assign_op<double>,_0>
  local_20;
  
  local_20.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::swap_assign_op<double>,_1>
  .m_src = &local_30;
  local_20.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::swap_assign_op<double>,_1>
  .m_dst = &local_40;
  local_40.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>.m_data =
       (Scalar *)dst;
  local_30.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>.m_data =
       (Scalar *)src;
  local_20.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::swap_assign_op<double>,_1>
  .m_functor = func;
  local_20.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::swap_assign_op<double>,_1>
  .m_dstExpr = dst;
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::swap_assign_op<double>,_0>,_0,_4>
  ::run(&local_20);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}